

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterBuilder.cpp
# Opt level: O0

void slang::ast::ParameterBuilder::createDecls
               (Scope *scope,ParameterPortListSyntax *syntax,
               SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *results)

{
  bool bVar1;
  iterator_base<const_slang::syntax::ParameterDeclarationBaseSyntax_*> *in_RDX;
  undefined8 in_RSI;
  ParameterDeclarationBaseSyntax *in_RDI;
  Scope *unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *in_stack_00000020;
  ParameterDeclarationBaseSyntax *declaration;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ParameterDeclarationBaseSyntax> *__range2;
  bool lastLocal;
  iterator_base<const_slang::syntax::ParameterDeclarationBaseSyntax_*> *in_stack_ffffffffffffff78;
  self_type *in_stack_ffffffffffffff80;
  
  slang::syntax::SeparatedSyntaxList<slang::syntax::ParameterDeclarationBaseSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::ParameterDeclarationBaseSyntax> *)0x7584a6);
  slang::syntax::SeparatedSyntaxList<slang::syntax::ParameterDeclarationBaseSyntax>::end
            ((SeparatedSyntaxList<slang::syntax::ParameterDeclarationBaseSyntax> *)0x7584ba);
  while (bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ParameterDeclarationBaseSyntax>::iterator_base<const_slang::syntax::ParameterDeclarationBaseSyntax_*>_>
                           (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ParameterDeclarationBaseSyntax>::iterator_base<const_slang::syntax::ParameterDeclarationBaseSyntax_*>,_false>
    ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ParameterDeclarationBaseSyntax>::iterator_base<const_slang::syntax::ParameterDeclarationBaseSyntax_*>,_false>
                 *)0x7584e8);
    parsing::Token::operator_cast_to_bool((Token *)0x7584fb);
    std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::span
              ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
               0x75853e);
    in_stack_ffffffffffffff78 = in_RDX;
    createDecls(unaff_retaddr,in_RDI,SUB81((ulong)in_RSI >> 0x38,0),SUB81((ulong)in_RSI >> 0x30,0),
                (span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>)
                in_stack_00000008,in_stack_00000020);
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ParameterDeclarationBaseSyntax>::iterator_base<const_slang::syntax::ParameterDeclarationBaseSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ParameterDeclarationBaseSyntax>::iterator_base<const_slang::syntax::ParameterDeclarationBaseSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ParameterDeclarationBaseSyntax>::iterator_base<const_slang::syntax::ParameterDeclarationBaseSyntax_*>,_false>
                *)in_stack_ffffffffffffff80);
  }
  return;
}

Assistant:

void ParameterBuilder::createDecls(const Scope& scope, const ParameterPortListSyntax& syntax,
                                   SmallVectorBase<Decl>& results) {
    bool lastLocal = false;
    for (auto declaration : syntax.declarations) {
        // It's legal to leave off the parameter keyword in the parameter port list.
        // If you do so, we "inherit" the parameter or localparam keyword from the
        // previous entry.
        if (declaration->keyword) {
            lastLocal = declaration->keyword.kind == parsing::TokenKind::LocalParamKeyword;
        }

        createDecls(scope, *declaration, lastLocal, /* isPort */ true, {}, results);
    }
}